

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O2

idx_t duckdb::TemplatedDistinctSelectOperation<duckdb::NotDistinctFrom>
                (Vector *left,Vector *right,optional_ptr<const_duckdb::SelectionVector,_true> sel,
                idx_t count,optional_ptr<duckdb::SelectionVector,_true> true_sel,
                optional_ptr<duckdb::SelectionVector,_true> false_sel,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  PhysicalType PVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  data_t *pdVar5;
  long *plVar6;
  data_ptr_t pdVar7;
  data_ptr_t pdVar8;
  int *piVar9;
  short *psVar10;
  UnifiedVectorFormat *pUVar11;
  idx_t i_6;
  SelectionVector *pSVar12;
  ValidityMask *pVVar13;
  ulong uVar14;
  TemplatedValidityMask<unsigned_long> *this;
  Vector *pVVar15;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  idx_t iVar16;
  reference pvVar17;
  type pVVar18;
  ulong uVar19;
  idx_t iVar20;
  InternalException *this_02;
  NotImplementedException *this_03;
  ulong uVar21;
  idx_t iVar22;
  optional_ptr<duckdb::SelectionVector,_true> oVar23;
  long lVar24;
  idx_t i;
  ulong uVar25;
  interval_t *piVar26;
  double *pdVar27;
  float *pfVar28;
  string_t *psVar29;
  uhugeint_t *puVar30;
  hugeint_t *phVar31;
  idx_t i_14;
  optional_ptr<duckdb::ValidityMask,_true> null_mask_00;
  sel_t sVar32;
  ulong uVar33;
  optional_ptr<const_duckdb::SelectionVector,_true> oVar34;
  idx_t false_count_13;
  idx_t i_8;
  ValidityMask *pVVar35;
  idx_t i_17;
  idx_t iVar36;
  idx_t pos;
  idx_t iVar37;
  idx_t pos_1;
  interval_t *piVar38;
  double *pdVar39;
  float *pfVar40;
  string_t *psVar41;
  uhugeint_t *puVar42;
  hugeint_t *phVar43;
  bool bVar44;
  bool bVar45;
  idx_t local_4c0;
  ulong local_4a0;
  TemplatedValidityMask<unsigned_long> *local_498;
  UnifiedVectorFormat lvdata;
  optional_ptr<duckdb::ValidityMask,_true> local_420;
  UnifiedVectorFormat rvdata;
  optional_ptr<duckdb::ValidityMask,_true> local_3b0;
  SelectionVector lcursor;
  idx_t local_390;
  SelectionVector rcursor;
  SelectionVector maybe_vec;
  SelectionVector true_sel_2;
  SelectionVector true_sel_1;
  SelectionVector slice_sel;
  Vector lchild;
  SelectionVector false_sel_1;
  OptionalSelection false_opt;
  optional_ptr<duckdb::SelectionVector,_true> local_260;
  optional_ptr<const_duckdb::SelectionVector,_true> local_258;
  OptionalSelection true_opt;
  UnifiedVectorFormat rvdata_1;
  UnifiedVectorFormat lvdata_1;
  optional_ptr<duckdb::SelectionVector,_true> local_1a0;
  SelectionVector false_vec;
  SelectionVector true_vec;
  Vector rchild;
  Vector l_not_null;
  Vector r_not_null;
  
  PVar1 = (left->type).physical_type_;
  switch(PVar1) {
  case BOOL:
  case INT8:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar35 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = pdVar7[iVar20] != pdVar8[iVar20];
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
          return local_4c0;
        }
        iVar20 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = pdVar7[iVar20] != pdVar8[iVar20];
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
          return local_4c0;
        }
        lVar24 = 0;
        for (; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar44 && bVar45) {
            bVar44 = pdVar7[iVar20] != pdVar8[iVar20];
          }
          else {
            bVar44 = bVar44 != bVar45;
          }
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + (ulong)bVar44;
        }
LAB_017a0a64:
        return count - lVar24;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar7 = left->data;
        pdVar8 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar45 | !bVar44) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar44);
              }
              else {
                bVar45 = pdVar7[iVar20] != *pdVar8;
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar45;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = pdVar7[iVar20] != *pdVar8;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = pdVar7[iVar20] != *pdVar8;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar45;
          }
        }
        goto LAB_017a1677;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar5 = left->data;
        pdVar7 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if ((bVar44 | !bVar45) == 1) {
                bVar44 = (bool)(bVar44 ^ !bVar45);
              }
              else {
                bVar44 = *pdVar5 != pdVar7[iVar20];
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar44;
            }
LAB_017a166a:
            local_4c0 = count - lVar24;
          }
          else {
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if ((bVar44 | !bVar45) == 1) {
                bVar44 = (bool)(bVar44 ^ !bVar45);
              }
              else {
                bVar44 = *pdVar5 != pdVar7[iVar20];
              }
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + (bVar44 ^ 1);
            }
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *pdVar5 != pdVar7[iVar20];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
        }
LAB_017a1677:
        pUVar11 = &lvdata;
        goto LAB_017a167c;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        if ((bVar44 | bVar45) == 1) {
          if (bVar44 == bVar45) {
LAB_0179d57f:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
                iVar16 = iVar20;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
                }
                (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
              }
              return count;
            }
            return count;
          }
        }
        else if (*left->data == *right->data) goto LAB_0179d57f;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar20 = 0;
        local_4c0 = 0;
        for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
          iVar36 = iVar16;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
          }
          iVar22 = iVar16;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
          }
          iVar37 = iVar16;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 != bVar44) goto LAB_01797374;
LAB_01797386:
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          else {
            if (lvdata.data[iVar22] == rvdata.data[iVar37]) goto LAB_01797386;
LAB_01797374:
            iVar22 = iVar20;
            iVar20 = iVar20 + 1;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
        }
        goto LAB_0179fa33;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          iVar36 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 == bVar44) goto LAB_01799776;
          }
          else if (lvdata.data[iVar36] == rvdata.data[iVar22]) {
LAB_01799776:
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0179fa33;
      }
      lVar24 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        bVar44 = true;
        bVar45 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
        }
        if ((bVar45 & bVar44) == 0) {
          if (bVar45 != bVar44) goto LAB_0179d545;
        }
        else if (lvdata.data[iVar36] != rvdata.data[iVar22]) {
LAB_0179d545:
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + 1;
        }
      }
LAB_0179f675:
      local_4c0 = count - lVar24;
      goto LAB_0179fa33;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
        iVar36 = iVar16;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
        }
        iVar22 = iVar16;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
        }
        iVar37 = iVar16;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
        }
        if (lvdata.data[iVar22] == rvdata.data[iVar37]) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar36;
        iVar20 = iVar22;
      }
      goto LAB_0179fa33;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (lvdata.data[iVar36] == rvdata.data[iVar22]) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0179fa33;
    }
    lVar24 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar16 = iVar20;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
      }
      iVar36 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (lvdata.data[iVar36] != rvdata.data[iVar22]) {
        (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
        lVar24 = lVar24 + 1;
      }
    }
    break;
  case UINT8:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar35 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = pdVar7[iVar20] != pdVar8[iVar20];
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
          return local_4c0;
        }
        iVar20 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = pdVar7[iVar20] != pdVar8[iVar20];
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
          return local_4c0;
        }
        lVar24 = 0;
        for (; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar44 && bVar45) {
            bVar44 = pdVar7[iVar20] != pdVar8[iVar20];
          }
          else {
            bVar44 = bVar44 != bVar45;
          }
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + (ulong)bVar44;
        }
        goto LAB_017a0a64;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar7 = left->data;
        pdVar8 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar45 | !bVar44) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar44);
              }
              else {
                bVar45 = pdVar7[iVar20] != *pdVar8;
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar45;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = pdVar7[iVar20] != *pdVar8;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = pdVar7[iVar20] != *pdVar8;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar45;
          }
        }
        goto LAB_017a1677;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar5 = left->data;
        pdVar7 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if ((bVar44 | !bVar45) == 1) {
                bVar44 = (bool)(bVar44 ^ !bVar45);
              }
              else {
                bVar44 = *pdVar5 != pdVar7[iVar20];
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar44;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *pdVar5 != pdVar7[iVar20];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *pdVar5 != pdVar7[iVar20];
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
        }
        goto LAB_017a1677;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        if ((bVar44 | bVar45) == 1) {
          if (bVar44 == bVar45) {
LAB_0179fe77:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
                iVar16 = iVar20;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
                }
                (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
              }
              return count;
            }
            return count;
          }
        }
        else if (*left->data == *right->data) goto LAB_0179fe77;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar20 = 0;
        local_4c0 = 0;
        for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
          iVar36 = iVar16;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
          }
          iVar22 = iVar16;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
          }
          iVar37 = iVar16;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 != bVar44) goto LAB_0179962a;
LAB_0179963c:
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          else {
            if (lvdata.data[iVar22] == rvdata.data[iVar37]) goto LAB_0179963c;
LAB_0179962a:
            iVar22 = iVar20;
            iVar20 = iVar20 + 1;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
        }
        goto LAB_0179fa33;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          iVar36 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 == bVar44) goto LAB_0179b0a3;
          }
          else if (lvdata.data[iVar36] == rvdata.data[iVar22]) {
LAB_0179b0a3:
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0179fa33;
      }
      lVar24 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        bVar44 = true;
        bVar45 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
        }
        if ((bVar45 & bVar44) == 0) {
          if (bVar45 != bVar44) goto LAB_0179f2e6;
        }
        else if (lvdata.data[iVar36] != rvdata.data[iVar22]) {
LAB_0179f2e6:
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + 1;
        }
      }
      goto LAB_0179f675;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
        iVar36 = iVar16;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
        }
        iVar22 = iVar16;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
        }
        iVar37 = iVar16;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
        }
        if (lvdata.data[iVar22] == rvdata.data[iVar37]) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar36;
        iVar20 = iVar22;
      }
      goto LAB_0179fa33;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (lvdata.data[iVar36] == rvdata.data[iVar22]) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0179fa33;
    }
    lVar24 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar16 = iVar20;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
      }
      iVar36 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (lvdata.data[iVar36] != rvdata.data[iVar22]) {
        (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
        lVar24 = lVar24 + 1;
      }
    }
    break;
  case UINT16:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar35 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = *(short *)(pdVar7 + iVar20 * 2) != *(short *)(pdVar8 + iVar20 * 2);
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
          return local_4c0;
        }
        iVar20 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = *(short *)(pdVar7 + iVar20 * 2) != *(short *)(pdVar8 + iVar20 * 2);
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
          return local_4c0;
        }
        lVar24 = 0;
        for (; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar44 && bVar45) {
            bVar44 = *(short *)(pdVar7 + iVar20 * 2) != *(short *)(pdVar8 + iVar20 * 2);
          }
          else {
            bVar44 = bVar44 != bVar45;
          }
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + (ulong)bVar44;
        }
        goto LAB_017a0a64;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar7 = left->data;
        psVar10 = (short *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar45 | !bVar44) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar44);
              }
              else {
                bVar45 = *(short *)(pdVar7 + iVar20 * 2) != *psVar10;
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar45;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = *(short *)(pdVar7 + iVar20 * 2) != *psVar10;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = *(short *)(pdVar7 + iVar20 * 2) != *psVar10;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar45;
          }
        }
        goto LAB_017a1677;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar10 = (short *)left->data;
        pdVar7 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if ((bVar44 | !bVar45) == 1) {
                bVar44 = (bool)(bVar44 ^ !bVar45);
              }
              else {
                bVar44 = *psVar10 != *(short *)(pdVar7 + iVar20 * 2);
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar44;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *psVar10 != *(short *)(pdVar7 + iVar20 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *psVar10 != *(short *)(pdVar7 + iVar20 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
        }
        goto LAB_017a1677;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        if ((bVar44 | bVar45) == 1) {
          if (bVar44 == bVar45) {
LAB_0179fd1f:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
                iVar16 = iVar20;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
                }
                (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(short *)left->data == *(short *)right->data) goto LAB_0179fd1f;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar20 = 0;
        local_4c0 = 0;
        for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
          iVar36 = iVar16;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
          }
          iVar22 = iVar16;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
          }
          iVar37 = iVar16;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 != bVar44) goto LAB_01799492;
LAB_017994a4:
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          else {
            if (*(short *)(lvdata.data + iVar22 * 2) == *(short *)(rvdata.data + iVar37 * 2))
            goto LAB_017994a4;
LAB_01799492:
            iVar22 = iVar20;
            iVar20 = iVar20 + 1;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
        }
        goto LAB_0179fa33;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          iVar36 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 == bVar44) goto LAB_0179ae37;
          }
          else if (*(short *)(lvdata.data + iVar36 * 2) == *(short *)(rvdata.data + iVar22 * 2)) {
LAB_0179ae37:
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0179fa33;
      }
      lVar24 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        bVar44 = true;
        bVar45 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
        }
        if ((bVar45 & bVar44) == 0) {
          if (bVar45 != bVar44) goto LAB_0179f0ec;
        }
        else if (*(short *)(lvdata.data + iVar36 * 2) != *(short *)(rvdata.data + iVar22 * 2)) {
LAB_0179f0ec:
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + 1;
        }
      }
      goto LAB_0179f675;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
        iVar36 = iVar16;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
        }
        iVar22 = iVar16;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
        }
        iVar37 = iVar16;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
        }
        if (*(short *)(lvdata.data + iVar22 * 2) == *(short *)(rvdata.data + iVar37 * 2)) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar36;
        iVar20 = iVar22;
      }
      goto LAB_0179fa33;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (*(short *)(lvdata.data + iVar36 * 2) == *(short *)(rvdata.data + iVar22 * 2)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0179fa33;
    }
    lVar24 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar16 = iVar20;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
      }
      iVar36 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (*(short *)(lvdata.data + iVar36 * 2) != *(short *)(rvdata.data + iVar22 * 2)) {
        (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
        lVar24 = lVar24 + 1;
      }
    }
    break;
  case INT16:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar35 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = *(short *)(pdVar7 + iVar20 * 2) != *(short *)(pdVar8 + iVar20 * 2);
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
          return local_4c0;
        }
        iVar20 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = *(short *)(pdVar7 + iVar20 * 2) != *(short *)(pdVar8 + iVar20 * 2);
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
          return local_4c0;
        }
        lVar24 = 0;
        for (; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar44 && bVar45) {
            bVar44 = *(short *)(pdVar7 + iVar20 * 2) != *(short *)(pdVar8 + iVar20 * 2);
          }
          else {
            bVar44 = bVar44 != bVar45;
          }
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + (ulong)bVar44;
        }
        goto LAB_017a0a64;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar7 = left->data;
        psVar10 = (short *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar45 | !bVar44) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar44);
              }
              else {
                bVar45 = *(short *)(pdVar7 + iVar20 * 2) != *psVar10;
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar45;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = *(short *)(pdVar7 + iVar20 * 2) != *psVar10;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = *(short *)(pdVar7 + iVar20 * 2) != *psVar10;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar45;
          }
        }
        goto LAB_017a1677;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar10 = (short *)left->data;
        pdVar7 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if ((bVar44 | !bVar45) == 1) {
                bVar44 = (bool)(bVar44 ^ !bVar45);
              }
              else {
                bVar44 = *psVar10 != *(short *)(pdVar7 + iVar20 * 2);
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar44;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *psVar10 != *(short *)(pdVar7 + iVar20 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *psVar10 != *(short *)(pdVar7 + iVar20 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
        }
        goto LAB_017a1677;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        if ((bVar44 | bVar45) == 1) {
          if (bVar44 == bVar45) {
LAB_017a00e0:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
                iVar16 = iVar20;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
                }
                (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(short *)left->data == *(short *)right->data) goto LAB_017a00e0;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar20 = 0;
        local_4c0 = 0;
        for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
          iVar36 = iVar16;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
          }
          iVar22 = iVar16;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
          }
          iVar37 = iVar16;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 != bVar44) goto LAB_01799a0a;
LAB_01799a1c:
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          else {
            if (*(short *)(lvdata.data + iVar22 * 2) == *(short *)(rvdata.data + iVar37 * 2))
            goto LAB_01799a1c;
LAB_01799a0a:
            iVar22 = iVar20;
            iVar20 = iVar20 + 1;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
        }
        goto LAB_0179fa33;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          iVar36 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 == bVar44) goto LAB_0179b4bf;
          }
          else if (*(short *)(lvdata.data + iVar36 * 2) == *(short *)(rvdata.data + iVar22 * 2)) {
LAB_0179b4bf:
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0179fa33;
      }
      lVar24 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        bVar44 = true;
        bVar45 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
        }
        if ((bVar45 & bVar44) == 0) {
          if (bVar45 != bVar44) goto LAB_0179f65e;
        }
        else if (*(short *)(lvdata.data + iVar36 * 2) != *(short *)(rvdata.data + iVar22 * 2)) {
LAB_0179f65e:
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + 1;
        }
      }
      goto LAB_0179f675;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
        iVar36 = iVar16;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
        }
        iVar22 = iVar16;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
        }
        iVar37 = iVar16;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
        }
        if (*(short *)(lvdata.data + iVar22 * 2) == *(short *)(rvdata.data + iVar37 * 2)) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar36;
        iVar20 = iVar22;
      }
      goto LAB_0179fa33;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (*(short *)(lvdata.data + iVar36 * 2) == *(short *)(rvdata.data + iVar22 * 2)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0179fa33;
    }
    lVar24 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar16 = iVar20;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
      }
      iVar36 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (*(short *)(lvdata.data + iVar36 * 2) != *(short *)(rvdata.data + iVar22 * 2)) {
        (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
        lVar24 = lVar24 + 1;
      }
    }
    break;
  case UINT32:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar35 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = *(int *)(pdVar7 + iVar20 * 4) != *(int *)(pdVar8 + iVar20 * 4);
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
          return local_4c0;
        }
        iVar20 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = *(int *)(pdVar7 + iVar20 * 4) != *(int *)(pdVar8 + iVar20 * 4);
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
          return local_4c0;
        }
        lVar24 = 0;
        for (; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar44 && bVar45) {
            bVar44 = *(int *)(pdVar7 + iVar20 * 4) != *(int *)(pdVar8 + iVar20 * 4);
          }
          else {
            bVar44 = bVar44 != bVar45;
          }
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + (ulong)bVar44;
        }
        goto LAB_017a0a64;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar7 = left->data;
        piVar9 = (int *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar45 | !bVar44) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar44);
              }
              else {
                bVar45 = *(int *)(pdVar7 + iVar20 * 4) != *piVar9;
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar45;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = *(int *)(pdVar7 + iVar20 * 4) != *piVar9;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = *(int *)(pdVar7 + iVar20 * 4) != *piVar9;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar45;
          }
        }
        goto LAB_017a1677;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar9 = (int *)left->data;
        pdVar7 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if ((bVar44 | !bVar45) == 1) {
                bVar44 = (bool)(bVar44 ^ !bVar45);
              }
              else {
                bVar44 = *piVar9 != *(int *)(pdVar7 + iVar20 * 4);
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar44;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *piVar9 != *(int *)(pdVar7 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *piVar9 != *(int *)(pdVar7 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
        }
        goto LAB_017a1677;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        if ((bVar44 | bVar45) == 1) {
          if (bVar44 == bVar45) {
LAB_0179fc74:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
                iVar16 = iVar20;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
                }
                (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(int *)left->data == *(int *)right->data) goto LAB_0179fc74;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar20 = 0;
        local_4c0 = 0;
        for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
          iVar36 = iVar16;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
          }
          iVar22 = iVar16;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
          }
          iVar37 = iVar16;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 != bVar44) goto LAB_017993c4;
LAB_017993d6:
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          else {
            if (*(int *)(lvdata.data + iVar22 * 4) == *(int *)(rvdata.data + iVar37 * 4))
            goto LAB_017993d6;
LAB_017993c4:
            iVar22 = iVar20;
            iVar20 = iVar20 + 1;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
        }
        goto LAB_0179fa33;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          iVar36 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 == bVar44) goto LAB_0179acfd;
          }
          else if (*(int *)(lvdata.data + iVar36 * 4) == *(int *)(rvdata.data + iVar22 * 4)) {
LAB_0179acfd:
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0179fa33;
      }
      lVar24 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        bVar44 = true;
        bVar45 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
        }
        if ((bVar45 & bVar44) == 0) {
          if (bVar45 != bVar44) goto LAB_0179efeb;
        }
        else if (*(int *)(lvdata.data + iVar36 * 4) != *(int *)(rvdata.data + iVar22 * 4)) {
LAB_0179efeb:
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + 1;
        }
      }
      goto LAB_0179f675;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
        iVar36 = iVar16;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
        }
        iVar22 = iVar16;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
        }
        iVar37 = iVar16;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
        }
        if (*(int *)(lvdata.data + iVar22 * 4) == *(int *)(rvdata.data + iVar37 * 4)) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar36;
        iVar20 = iVar22;
      }
      goto LAB_0179fa33;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (*(int *)(lvdata.data + iVar36 * 4) == *(int *)(rvdata.data + iVar22 * 4)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0179fa33;
    }
    lVar24 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar16 = iVar20;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
      }
      iVar36 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (*(int *)(lvdata.data + iVar36 * 4) != *(int *)(rvdata.data + iVar22 * 4)) {
        (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
        lVar24 = lVar24 + 1;
      }
    }
    break;
  case INT32:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar35 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = *(int *)(pdVar7 + iVar20 * 4) != *(int *)(pdVar8 + iVar20 * 4);
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
          return local_4c0;
        }
        iVar20 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = *(int *)(pdVar7 + iVar20 * 4) != *(int *)(pdVar8 + iVar20 * 4);
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
          return local_4c0;
        }
        lVar24 = 0;
        for (; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar44 && bVar45) {
            bVar44 = *(int *)(pdVar7 + iVar20 * 4) != *(int *)(pdVar8 + iVar20 * 4);
          }
          else {
            bVar44 = bVar44 != bVar45;
          }
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + (ulong)bVar44;
        }
        goto LAB_017a0a64;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar7 = left->data;
        piVar9 = (int *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar45 | !bVar44) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar44);
              }
              else {
                bVar45 = *(int *)(pdVar7 + iVar20 * 4) != *piVar9;
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar45;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = *(int *)(pdVar7 + iVar20 * 4) != *piVar9;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = *(int *)(pdVar7 + iVar20 * 4) != *piVar9;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar45;
          }
        }
        goto LAB_017a1677;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar9 = (int *)left->data;
        pdVar7 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if ((bVar44 | !bVar45) == 1) {
                bVar44 = (bool)(bVar44 ^ !bVar45);
              }
              else {
                bVar44 = *piVar9 != *(int *)(pdVar7 + iVar20 * 4);
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar44;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *piVar9 != *(int *)(pdVar7 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *piVar9 != *(int *)(pdVar7 + iVar20 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
        }
        goto LAB_017a1677;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        if ((bVar44 | bVar45) == 1) {
          if (bVar44 == bVar45) {
LAB_0179fdcc:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
                iVar16 = iVar20;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
                }
                (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(int *)left->data == *(int *)right->data) goto LAB_0179fdcc;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar20 = 0;
        local_4c0 = 0;
        for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
          iVar36 = iVar16;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
          }
          iVar22 = iVar16;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
          }
          iVar37 = iVar16;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 != bVar44) goto LAB_0179955e;
LAB_01799570:
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          else {
            if (*(int *)(lvdata.data + iVar22 * 4) == *(int *)(rvdata.data + iVar37 * 4))
            goto LAB_01799570;
LAB_0179955e:
            iVar22 = iVar20;
            iVar20 = iVar20 + 1;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
        }
        goto LAB_0179fa33;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          iVar36 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 == bVar44) goto LAB_0179af6d;
          }
          else if (*(int *)(lvdata.data + iVar36 * 4) == *(int *)(rvdata.data + iVar22 * 4)) {
LAB_0179af6d:
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0179fa33;
      }
      lVar24 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        bVar44 = true;
        bVar45 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
        }
        if ((bVar45 & bVar44) == 0) {
          if (bVar45 != bVar44) goto LAB_0179f1e9;
        }
        else if (*(int *)(lvdata.data + iVar36 * 4) != *(int *)(rvdata.data + iVar22 * 4)) {
LAB_0179f1e9:
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + 1;
        }
      }
      goto LAB_0179f675;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
        iVar36 = iVar16;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
        }
        iVar22 = iVar16;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
        }
        iVar37 = iVar16;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
        }
        if (*(int *)(lvdata.data + iVar22 * 4) == *(int *)(rvdata.data + iVar37 * 4)) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar36;
        iVar20 = iVar22;
      }
      goto LAB_0179fa33;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (*(int *)(lvdata.data + iVar36 * 4) == *(int *)(rvdata.data + iVar22 * 4)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0179fa33;
    }
    lVar24 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar16 = iVar20;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
      }
      iVar36 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (*(int *)(lvdata.data + iVar36 * 4) != *(int *)(rvdata.data + iVar22 * 4)) {
        (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
        lVar24 = lVar24 + 1;
      }
    }
    break;
  case UINT64:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar35 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = *(long *)(pdVar7 + iVar20 * 8) != *(long *)(pdVar8 + iVar20 * 8);
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
          return local_4c0;
        }
        iVar20 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = *(long *)(pdVar7 + iVar20 * 8) != *(long *)(pdVar8 + iVar20 * 8);
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
          return local_4c0;
        }
        lVar24 = 0;
        for (; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar44 && bVar45) {
            bVar44 = *(long *)(pdVar7 + iVar20 * 8) != *(long *)(pdVar8 + iVar20 * 8);
          }
          else {
            bVar44 = bVar44 != bVar45;
          }
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + (ulong)bVar44;
        }
        goto LAB_017a0a64;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar7 = left->data;
        plVar6 = (long *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar45 | !bVar44) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar44);
              }
              else {
                bVar45 = *(long *)(pdVar7 + iVar20 * 8) != *plVar6;
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar45;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = *(long *)(pdVar7 + iVar20 * 8) != *plVar6;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = *(long *)(pdVar7 + iVar20 * 8) != *plVar6;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar45;
          }
        }
        goto LAB_017a1677;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        plVar6 = (long *)left->data;
        pdVar7 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if ((bVar44 | !bVar45) == 1) {
                bVar44 = (bool)(bVar44 ^ !bVar45);
              }
              else {
                bVar44 = *plVar6 != *(long *)(pdVar7 + iVar20 * 8);
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar44;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *plVar6 != *(long *)(pdVar7 + iVar20 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *plVar6 != *(long *)(pdVar7 + iVar20 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
        }
        goto LAB_017a1677;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        if ((bVar44 | bVar45) == 1) {
          if (bVar44 == bVar45) {
LAB_0179fbc7:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
                iVar16 = iVar20;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
                }
                (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(long *)left->data == *(long *)right->data) goto LAB_0179fbc7;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar20 = 0;
        local_4c0 = 0;
        for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
          iVar36 = iVar16;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
          }
          iVar22 = iVar16;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
          }
          iVar37 = iVar16;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 != bVar44) goto LAB_017992f8;
LAB_0179930a:
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          else {
            if (*(long *)(lvdata.data + iVar22 * 8) == *(long *)(rvdata.data + iVar37 * 8))
            goto LAB_0179930a;
LAB_017992f8:
            iVar22 = iVar20;
            iVar20 = iVar20 + 1;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
        }
        goto LAB_0179fa33;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          iVar36 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 == bVar44) goto LAB_0179abc7;
          }
          else if (*(long *)(lvdata.data + iVar36 * 8) == *(long *)(rvdata.data + iVar22 * 8)) {
LAB_0179abc7:
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0179fa33;
      }
      lVar24 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        bVar44 = true;
        bVar45 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
        }
        if ((bVar45 & bVar44) == 0) {
          if (bVar45 != bVar44) goto LAB_0179eeee;
        }
        else if (*(long *)(lvdata.data + iVar36 * 8) != *(long *)(rvdata.data + iVar22 * 8)) {
LAB_0179eeee:
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + 1;
        }
      }
      goto LAB_0179f675;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
        iVar36 = iVar16;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
        }
        iVar22 = iVar16;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
        }
        iVar37 = iVar16;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
        }
        if (*(long *)(lvdata.data + iVar22 * 8) == *(long *)(rvdata.data + iVar37 * 8)) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar36;
        iVar20 = iVar22;
      }
      goto LAB_0179fa33;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (*(long *)(lvdata.data + iVar36 * 8) == *(long *)(rvdata.data + iVar22 * 8)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0179fa33;
    }
    lVar24 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar16 = iVar20;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
      }
      iVar36 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (*(long *)(lvdata.data + iVar36 * 8) != *(long *)(rvdata.data + iVar22 * 8)) {
        (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
        lVar24 = lVar24 + 1;
      }
    }
    break;
  case INT64:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar7 = left->data;
        pdVar8 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar35 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = *(long *)(pdVar7 + iVar20 * 8) != *(long *)(pdVar8 + iVar20 * 8);
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
          return local_4c0;
        }
        iVar20 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (bVar44 && bVar45) {
              bVar44 = *(long *)(pdVar7 + iVar20 * 8) != *(long *)(pdVar8 + iVar20 * 8);
            }
            else {
              bVar44 = bVar44 != bVar45;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
          return local_4c0;
        }
        lVar24 = 0;
        for (; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
          if (bVar44 && bVar45) {
            bVar44 = *(long *)(pdVar7 + iVar20 * 8) != *(long *)(pdVar8 + iVar20 * 8);
          }
          else {
            bVar44 = bVar44 != bVar45;
          }
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + (ulong)bVar44;
        }
        goto LAB_017a0a64;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar7 = left->data;
        plVar6 = (long *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar45 | !bVar44) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar44);
              }
              else {
                bVar45 = *(long *)(pdVar7 + iVar20 * 8) != *plVar6;
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar45;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = *(long *)(pdVar7 + iVar20 * 8) != *plVar6;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar45 | !bVar44) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar44);
            }
            else {
              bVar45 = *(long *)(pdVar7 + iVar20 * 8) != *plVar6;
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar45 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar45;
          }
        }
        goto LAB_017a1677;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        plVar6 = (long *)left->data;
        pdVar7 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if ((bVar44 | !bVar45) == 1) {
                bVar44 = (bool)(bVar44 ^ !bVar45);
              }
              else {
                bVar44 = *plVar6 != *(long *)(pdVar7 + iVar20 * 8);
              }
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)bVar44;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *plVar6 != *(long *)(pdVar7 + iVar20 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if ((bVar44 | !bVar45) == 1) {
              bVar44 = (bool)(bVar44 ^ !bVar45);
            }
            else {
              bVar44 = *plVar6 != *(long *)(pdVar7 + iVar20 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + (bVar44 ^ 1);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)bVar44;
          }
        }
        goto LAB_017a1677;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        if ((bVar44 | bVar45) == 1) {
          if (bVar44 == bVar45) {
LAB_0179fb1a:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
                iVar16 = iVar20;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
                }
                (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(long *)left->data == *(long *)right->data) goto LAB_0179fb1a;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        iVar20 = 0;
        local_4c0 = 0;
        for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
          iVar36 = iVar16;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
          }
          iVar22 = iVar16;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
          }
          iVar37 = iVar16;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 != bVar44) goto LAB_0179922b;
LAB_0179923d:
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            local_4c0 = local_4c0 + 1;
          }
          else {
            if (*(long *)(lvdata.data + iVar22 * 8) == *(long *)(rvdata.data + iVar37 * 8))
            goto LAB_0179923d;
LAB_0179922b:
            iVar22 = iVar20;
            iVar20 = iVar20 + 1;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
        }
        goto LAB_0179fa33;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          iVar36 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          bVar44 = true;
          bVar45 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
          }
          if ((bVar45 & bVar44) == 0) {
            if (bVar45 == bVar44) goto LAB_0179aa91;
          }
          else if (*(long *)(lvdata.data + iVar36 * 8) == *(long *)(rvdata.data + iVar22 * 8)) {
LAB_0179aa91:
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0179fa33;
      }
      lVar24 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        bVar44 = true;
        bVar45 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar44 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0;
        }
        if ((bVar45 & bVar44) == 0) {
          if (bVar45 != bVar44) goto LAB_0179edf0;
        }
        else if (*(long *)(lvdata.data + iVar36 * 8) != *(long *)(rvdata.data + iVar22 * 8)) {
LAB_0179edf0:
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + 1;
        }
      }
      goto LAB_0179f675;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
        iVar36 = iVar16;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
        }
        iVar22 = iVar16;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
        }
        iVar37 = iVar16;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
        }
        if (*(long *)(lvdata.data + iVar22 * 8) == *(long *)(rvdata.data + iVar37 * 8)) {
          iVar22 = iVar20;
          iVar20 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar22 = iVar20 + 1;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar36;
        iVar20 = iVar22;
      }
      goto LAB_0179fa33;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (*(long *)(lvdata.data + iVar36 * 8) == *(long *)(rvdata.data + iVar22 * 8)) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0179fa33;
    }
    lVar24 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar16 = iVar20;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
      }
      iVar36 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (*(long *)(lvdata.data + iVar36 * 8) != *(long *)(rvdata.data + iVar22 * 8)) {
        (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
        lVar24 = lVar24 + 1;
      }
    }
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
switchD_01795edd_caseD_a:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&lvdata,"Invalid type for distinct selection",(allocator *)&rvdata);
    InternalException::InternalException(this_02,(string *)&lvdata);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar28 = (float *)left->data;
        pfVar40 = (float *)right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar35 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<float>(pfVar28,pfVar40,!bVar44,!bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)!bVar44;
            pfVar40 = pfVar40 + 1;
            pfVar28 = pfVar28 + 1;
          }
          return local_4c0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<float>(pfVar28,pfVar40,!bVar44,!bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            pfVar40 = pfVar40 + 1;
            pfVar28 = pfVar28 + 1;
          }
          return local_4c0;
        }
        lVar24 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar44 = NotDistinctFrom::Operation<float>(pfVar28,pfVar40,!bVar44,!bVar45);
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + (ulong)!bVar44;
          pfVar40 = pfVar40 + 1;
          pfVar28 = pfVar28 + 1;
        }
        goto LAB_017a0a64;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pfVar28 = (float *)left->data;
        pfVar40 = (float *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar44 = NotDistinctFrom::Operation<float>(pfVar28,pfVar40,!bVar44,bVar45);
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              pfVar28 = pfVar28 + 1;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar44 = NotDistinctFrom::Operation<float>(pfVar28,pfVar40,!bVar44,bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            pfVar28 = pfVar28 + 1;
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar44 = NotDistinctFrom::Operation<float>(pfVar28,pfVar40,!bVar44,bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)!bVar44;
            pfVar28 = pfVar28 + 1;
          }
        }
        goto LAB_017a1677;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar28 = (float *)left->data;
        pfVar40 = (float *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<float>(pfVar28,pfVar40,bVar44,!bVar45);
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              pfVar40 = pfVar40 + 1;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<float>(pfVar28,pfVar40,bVar44,!bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            pfVar40 = pfVar40 + 1;
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<float>(pfVar28,pfVar40,bVar44,!bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)!bVar44;
            pfVar40 = pfVar40 + 1;
          }
        }
        goto LAB_017a1677;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        bVar44 = NotDistinctFrom::Operation<float>
                           ((float *)left->data,(float *)right->data,bVar44,bVar45);
        if (!bVar44) {
          if (false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
          }
          return 0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
          }
          return count;
        }
        return count;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0 &&
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar25 = uVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar25 = (ulong)(sel.ptr)->sel_vector[uVar19];
          }
          uVar33 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar33 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          bVar44 = NotDistinctFrom::Operation<float>
                             ((float *)(lvdata.data + uVar33 * 4),
                              (float *)(rvdata.data + uVar21 * 4),false,false);
          if (bVar44) {
            iVar16 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar36 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar36 = iVar20 + 1;
            iVar16 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar16] = (sel_t)uVar25;
          iVar20 = iVar36;
        }
        goto LAB_0179fa33;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar25 = uVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar25 = (ulong)(sel.ptr)->sel_vector[uVar19];
          }
          uVar33 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar33 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          bVar44 = NotDistinctFrom::Operation<float>
                             ((float *)(lvdata.data + uVar33 * 4),
                              (float *)(rvdata.data + uVar21 * 4),false,false);
          if (bVar44) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar25;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0179fa33;
      }
      lVar24 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar25 = uVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar25 = (ulong)(sel.ptr)->sel_vector[uVar19];
        }
        uVar33 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar33 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        bVar44 = NotDistinctFrom::Operation<float>
                           ((float *)(lvdata.data + uVar33 * 4),(float *)(rvdata.data + uVar21 * 4),
                            false,false);
        if (!bVar44) {
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)uVar25;
          lVar24 = lVar24 + 1;
        }
      }
LAB_0179f824:
      local_4c0 = count - lVar24;
      goto LAB_0179fa33;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar25 = uVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar25 = (ulong)(sel.ptr)->sel_vector[uVar19];
        }
        uVar33 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar33 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0;
        }
        bVar44 = NotDistinctFrom::Operation<float>
                           ((float *)(lvdata.data + uVar33 * 4),(float *)(rvdata.data + uVar21 * 4),
                            bVar44,bVar45);
        if (bVar44) {
          iVar16 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          iVar36 = iVar20;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar36 = iVar20 + 1;
          iVar16 = iVar20;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar16] = (sel_t)uVar25;
        iVar20 = iVar36;
      }
      goto LAB_0179fa33;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar25 = uVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar25 = (ulong)(sel.ptr)->sel_vector[uVar19];
        }
        uVar33 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar33 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0;
        }
        bVar44 = NotDistinctFrom::Operation<float>
                           ((float *)(lvdata.data + uVar33 * 4),(float *)(rvdata.data + uVar21 * 4),
                            bVar44,bVar45);
        if (bVar44) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0179fa33;
    }
    lVar24 = 0;
    for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
      uVar25 = uVar19;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        uVar25 = (ulong)(sel.ptr)->sel_vector[uVar19];
      }
      uVar33 = uVar19;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar33 = (ulong)(lvdata.sel)->sel_vector[uVar19];
      }
      uVar21 = uVar19;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
      }
      if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar44 = false;
      }
      else {
        bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0;
      }
      if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar45 = false;
      }
      else {
        bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0;
      }
      bVar44 = NotDistinctFrom::Operation<float>
                         ((float *)(lvdata.data + uVar33 * 4),(float *)(rvdata.data + uVar21 * 4),
                          bVar44,bVar45);
      if (!bVar44) {
        (false_sel.ptr)->sel_vector[lVar24] = (sel_t)uVar25;
        lVar24 = lVar24 + 1;
      }
    }
    goto LAB_0179fa26;
  case DOUBLE:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar27 = (double *)left->data;
        pdVar39 = (double *)right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar35 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<double>(pdVar27,pdVar39,!bVar44,!bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)!bVar44;
            pdVar39 = pdVar39 + 1;
            pdVar27 = pdVar27 + 1;
          }
          return local_4c0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<double>(pdVar27,pdVar39,!bVar44,!bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            pdVar39 = pdVar39 + 1;
            pdVar27 = pdVar27 + 1;
          }
          return local_4c0;
        }
        lVar24 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar44 = NotDistinctFrom::Operation<double>(pdVar27,pdVar39,!bVar44,!bVar45);
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + (ulong)!bVar44;
          pdVar39 = pdVar39 + 1;
          pdVar27 = pdVar27 + 1;
        }
        goto LAB_017a0a64;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar27 = (double *)left->data;
        pdVar39 = (double *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar44 = NotDistinctFrom::Operation<double>(pdVar27,pdVar39,!bVar44,bVar45);
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              pdVar27 = pdVar27 + 1;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar44 = NotDistinctFrom::Operation<double>(pdVar27,pdVar39,!bVar44,bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            pdVar27 = pdVar27 + 1;
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar44 = NotDistinctFrom::Operation<double>(pdVar27,pdVar39,!bVar44,bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)!bVar44;
            pdVar27 = pdVar27 + 1;
          }
        }
        goto LAB_017a1677;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar27 = (double *)left->data;
        pdVar39 = (double *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<double>(pdVar27,pdVar39,bVar44,!bVar45);
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              pdVar39 = pdVar39 + 1;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<double>(pdVar27,pdVar39,bVar44,!bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            pdVar39 = pdVar39 + 1;
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<double>(pdVar27,pdVar39,bVar44,!bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)!bVar44;
            pdVar39 = pdVar39 + 1;
          }
        }
        goto LAB_017a1677;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        bVar44 = NotDistinctFrom::Operation<double>
                           ((double *)left->data,(double *)right->data,bVar44,bVar45);
        if (!bVar44) {
          if (false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
          }
          return 0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
          }
          return count;
        }
        return count;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0 &&
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar25 = uVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar25 = (ulong)(sel.ptr)->sel_vector[uVar19];
          }
          uVar33 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar33 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          bVar44 = NotDistinctFrom::Operation<double>
                             ((double *)(lvdata.data + uVar33 * 8),
                              (double *)(rvdata.data + uVar21 * 8),false,false);
          if (bVar44) {
            iVar16 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar36 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar36 = iVar20 + 1;
            iVar16 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar16] = (sel_t)uVar25;
          iVar20 = iVar36;
        }
        goto LAB_0179fa33;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
          uVar25 = uVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar25 = (ulong)(sel.ptr)->sel_vector[uVar19];
          }
          uVar33 = uVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar33 = (ulong)(lvdata.sel)->sel_vector[uVar19];
          }
          uVar21 = uVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
          }
          bVar44 = NotDistinctFrom::Operation<double>
                             ((double *)(lvdata.data + uVar33 * 8),
                              (double *)(rvdata.data + uVar21 * 8),false,false);
          if (bVar44) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar25;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0179fa33;
      }
      lVar24 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar25 = uVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar25 = (ulong)(sel.ptr)->sel_vector[uVar19];
        }
        uVar33 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar33 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        bVar44 = NotDistinctFrom::Operation<double>
                           ((double *)(lvdata.data + uVar33 * 8),
                            (double *)(rvdata.data + uVar21 * 8),false,false);
        if (!bVar44) {
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)uVar25;
          lVar24 = lVar24 + 1;
        }
      }
      goto LAB_0179f824;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar25 = uVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar25 = (ulong)(sel.ptr)->sel_vector[uVar19];
        }
        uVar33 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar33 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0;
        }
        bVar44 = NotDistinctFrom::Operation<double>
                           ((double *)(lvdata.data + uVar33 * 8),
                            (double *)(rvdata.data + uVar21 * 8),bVar44,bVar45);
        if (bVar44) {
          iVar16 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          iVar36 = iVar20;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar36 = iVar20 + 1;
          iVar16 = iVar20;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar16] = (sel_t)uVar25;
        iVar20 = iVar36;
      }
      goto LAB_0179fa33;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
        uVar25 = uVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar25 = (ulong)(sel.ptr)->sel_vector[uVar19];
        }
        uVar33 = uVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar33 = (ulong)(lvdata.sel)->sel_vector[uVar19];
        }
        uVar21 = uVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0;
        }
        bVar44 = NotDistinctFrom::Operation<double>
                           ((double *)(lvdata.data + uVar33 * 8),
                            (double *)(rvdata.data + uVar21 * 8),bVar44,bVar45);
        if (bVar44) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)uVar25;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0179fa33;
    }
    lVar24 = 0;
    for (uVar19 = 0; count != uVar19; uVar19 = uVar19 + 1) {
      uVar25 = uVar19;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        uVar25 = (ulong)(sel.ptr)->sel_vector[uVar19];
      }
      uVar33 = uVar19;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar33 = (ulong)(lvdata.sel)->sel_vector[uVar19];
      }
      uVar21 = uVar19;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar21 = (ulong)(rvdata.sel)->sel_vector[uVar19];
      }
      if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar44 = false;
      }
      else {
        bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar33 >> 6] >> (uVar33 & 0x3f) & 1) == 0;
      }
      if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar45 = false;
      }
      else {
        bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0;
      }
      bVar44 = NotDistinctFrom::Operation<double>
                         ((double *)(lvdata.data + uVar33 * 8),(double *)(rvdata.data + uVar21 * 8),
                          bVar44,bVar45);
      if (!bVar44) {
        (false_sel.ptr)->sel_vector[lVar24] = (sel_t)uVar25;
        lVar24 = lVar24 + 1;
      }
    }
    goto LAB_0179fa26;
  case INTERVAL:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar26 = (interval_t *)left->data;
        piVar38 = (interval_t *)right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar35 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>(piVar26,piVar38,!bVar44,!bVar45)
            ;
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)!bVar44;
            piVar38 = piVar38 + 1;
            piVar26 = piVar26 + 1;
          }
          return local_4c0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>(piVar26,piVar38,!bVar44,!bVar45)
            ;
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            piVar38 = piVar38 + 1;
            piVar26 = piVar26 + 1;
          }
          return local_4c0;
        }
        lVar24 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
          bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>(piVar26,piVar38,!bVar44,!bVar45);
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + (ulong)!bVar44;
          piVar38 = piVar38 + 1;
          piVar26 = piVar26 + 1;
        }
        goto LAB_017a0a64;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar26 = (interval_t *)left->data;
        piVar38 = (interval_t *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        iVar20 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>
                                 (piVar26,piVar38,!bVar44,bVar45);
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              piVar26 = piVar26 + 1;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>(piVar26,piVar38,!bVar44,bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            piVar26 = piVar26 + 1;
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>(piVar26,piVar38,!bVar44,bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)!bVar44;
            piVar26 = piVar26 + 1;
          }
        }
        goto LAB_017a1677;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar26 = (interval_t *)left->data;
        piVar38 = (interval_t *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>
                                 (piVar26,piVar38,bVar44,!bVar45);
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              piVar38 = piVar38 + 1;
            }
            goto LAB_017a166a;
          }
          local_4c0 = 0;
          for (; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>(piVar26,piVar38,bVar44,!bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            piVar38 = piVar38 + 1;
          }
        }
        else {
          lVar24 = 0;
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar44 = false;
            }
            else {
              bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>(piVar26,piVar38,bVar44,!bVar45);
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + bVar44;
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)!bVar44;
            piVar38 = piVar38 + 1;
          }
        }
        goto LAB_017a1677;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>
                           ((interval_t *)left->data,(interval_t *)right->data,bVar44,bVar45);
        if (!bVar44) {
          if (false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
          }
          return 0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
          }
          return count;
        }
        return count;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0 &&
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
          iVar36 = iVar16;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
          }
          iVar22 = iVar16;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
          }
          iVar37 = iVar16;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
          }
          bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>
                             ((interval_t *)(lvdata.data + iVar22 * 0x10),
                              (interval_t *)(rvdata.data + iVar37 * 0x10),false,false);
          if (bVar44) {
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar37 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar37 = iVar20 + 1;
            iVar22 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
          iVar20 = iVar37;
        }
        goto LAB_0179fa33;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          iVar36 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>
                             ((interval_t *)(lvdata.data + iVar36 * 0x10),
                              (interval_t *)(rvdata.data + iVar22 * 0x10),false,false);
          if (bVar44) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0179fa33;
      }
      lVar24 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>
                           ((interval_t *)(lvdata.data + iVar36 * 0x10),
                            (interval_t *)(rvdata.data + iVar22 * 0x10),false,false);
        if (!bVar44) {
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + 1;
        }
      }
      goto LAB_0179f824;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      iVar20 = 0;
      for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
        iVar36 = iVar16;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
        }
        iVar22 = iVar16;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
        }
        iVar37 = iVar16;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) == 0;
        }
        bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>
                           ((interval_t *)(lvdata.data + iVar22 * 0x10),
                            (interval_t *)(rvdata.data + iVar37 * 0x10),bVar44,bVar45);
        if (bVar44) {
          iVar22 = local_4c0;
          oVar23.ptr = true_sel.ptr;
          iVar37 = iVar20;
          local_4c0 = local_4c0 + 1;
        }
        else {
          iVar37 = iVar20 + 1;
          iVar22 = iVar20;
          oVar23.ptr = false_sel.ptr;
        }
        (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
        iVar20 = iVar37;
      }
      goto LAB_0179fa33;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4c0 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
        }
        bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>
                           ((interval_t *)(lvdata.data + iVar36 * 0x10),
                            (interval_t *)(rvdata.data + iVar22 * 0x10),bVar44,bVar45);
        if (bVar44) {
          (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
          local_4c0 = local_4c0 + 1;
        }
      }
      goto LAB_0179fa33;
    }
    lVar24 = 0;
    for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
      iVar16 = iVar20;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
      }
      iVar36 = iVar20;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
      }
      iVar22 = iVar20;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
      }
      if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar44 = false;
      }
      else {
        bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
      }
      if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar45 = false;
      }
      else {
        bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
      }
      bVar44 = NotDistinctFrom::Operation<duckdb::interval_t>
                         ((interval_t *)(lvdata.data + iVar36 * 0x10),
                          (interval_t *)(rvdata.data + iVar22 * 0x10),bVar44,bVar45);
      if (!bVar44) {
        (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
        lVar24 = lVar24 + 1;
      }
    }
    goto LAB_0179fa26;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_260.ptr = false_sel.ptr;
    local_258.ptr = sel.ptr;
    local_1a0.ptr = true_sel.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_258.ptr = FlatVector::IncrementalSelectionVector();
    }
    SelectionVector::SelectionVector(&true_vec,count);
    OptionalSelection::OptionalSelection(&true_opt,&true_vec);
    SelectionVector::SelectionVector(&false_vec,count);
    OptionalSelection::OptionalSelection(&false_opt,&false_vec);
    SelectionVector::SelectionVector(&maybe_vec,count);
    Vector::Vector(&l_not_null,left);
    Vector::Vector(&r_not_null,right);
    pSVar12 = optional_ptr<const_duckdb::SelectionVector,_true>::operator*(&local_258);
    rchild._0_8_ = null_mask.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(&l_not_null,count,&lvdata);
    Vector::ToUnifiedFormat(&r_not_null,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0 &&
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      psVar2 = pSVar12->sel_vector;
      local_390 = 0;
      for (iVar20 = 0; uVar19 = count, count != iVar20; iVar20 = iVar20 + 1) {
        sVar32 = (sel_t)iVar20;
        if (psVar2 != (sel_t *)0x0) {
          sVar32 = psVar2[iVar20];
        }
        maybe_vec.sel_vector[iVar20] = sVar32;
      }
    }
    else {
      SelectionVector::SelectionVector((SelectionVector *)&lchild,count);
      local_390 = 0;
      iVar20 = 0;
      uVar19 = 0;
      for (uVar25 = 0; count != uVar25; uVar25 = uVar25 + 1) {
        uVar33 = uVar25;
        if (pSVar12->sel_vector != (sel_t *)0x0) {
          uVar33 = (ulong)pSVar12->sel_vector[uVar25];
        }
        uVar21 = uVar25;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar21 = (ulong)(lvdata.sel)->sel_vector[uVar25];
        }
        uVar14 = uVar25;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar14 = (ulong)(rvdata.sel)->sel_vector[uVar25];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar21 >> 6] >> (uVar21 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0;
        }
        sVar32 = (sel_t)uVar33;
        if ((bVar44 | bVar45) == 1) {
          if (rchild._0_8_ != 0) {
            this = &optional_ptr<duckdb::ValidityMask,_true>::operator->
                              ((optional_ptr<duckdb::ValidityMask,_true> *)&rchild)->
                    super_TemplatedValidityMask<unsigned_long>;
            TemplatedValidityMask<unsigned_long>::SetInvalid(this,uVar33);
          }
          if (bVar44 == bVar45) {
            if (true_opt.sel != (SelectionVector *)0x0) {
              (true_opt.sel)->sel_vector[local_390] = sVar32;
            }
            local_390 = local_390 + 1;
          }
          else {
            if (false_opt.sel != (SelectionVector *)0x0) {
              (false_opt.sel)->sel_vector[iVar20] = sVar32;
            }
            iVar20 = iVar20 + 1;
          }
        }
        else {
          *(int *)(lchild._0_8_ + uVar19 * 4) = (int)uVar25;
          maybe_vec.sel_vector[uVar19] = sVar32;
          uVar19 = uVar19 + 1;
        }
      }
      OptionalSelection::Advance(&true_opt,local_390);
      OptionalSelection::Advance(&false_opt,iVar20);
      if (uVar19 < count && uVar19 != 0) {
        Vector::Slice(&l_not_null,(SelectionVector *)&lchild,uVar19);
        Vector::Slice(&r_not_null,(SelectionVector *)&lchild,uVar19);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&lchild.type.type_info_);
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&rvdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&lvdata);
    PVar1 = (left->type).physical_type_;
    if (PVar1 == LIST) {
      local_420 = (optional_ptr<duckdb::ValidityMask,_true>)
                  (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
      if (uVar19 == 0) goto LAB_01796f19;
      SelectionVector::SelectionVector(&lcursor,uVar19);
      SelectionVector::SelectionVector(&rcursor,uVar19);
      pVVar15 = ListVector::GetEntry(&l_not_null);
      Vector::Vector((Vector *)&lvdata,pVVar15);
      pVVar15 = ListVector::GetEntry(&r_not_null);
      Vector::Vector((Vector *)&rvdata,pVVar15);
      iVar20 = ListVector::GetListSize(&l_not_null);
      Vector::Flatten((Vector *)&lvdata,iVar20);
      iVar20 = ListVector::GetListSize(&r_not_null);
      Vector::Flatten((Vector *)&rvdata,iVar20);
      Vector::Vector(&lchild,(Vector *)&lvdata,&lcursor,uVar19);
      Vector::Vector(&rchild,(Vector *)&rvdata,&rcursor,uVar19);
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata_1);
      Vector::ToUnifiedFormat(&l_not_null,uVar19,&lvdata_1);
      pdVar7 = lvdata_1.data;
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata_1);
      Vector::ToUnifiedFormat(&r_not_null,uVar19,&rvdata_1);
      SelectionVector::SelectionVector(&slice_sel,uVar19);
      for (iVar20 = 0; uVar19 != iVar20; iVar20 = iVar20 + 1) {
        slice_sel.sel_vector[iVar20] = (sel_t)iVar20;
      }
      SelectionVector::SelectionVector(&true_sel_1,uVar19);
      SelectionVector::SelectionVector(&false_sel_1,uVar19);
      true_sel_2.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      true_sel_2.sel_vector = (sel_t *)0x0;
      true_sel_2.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if (local_420.ptr == (ValidityMask *)0x0) {
        local_3b0.ptr = (ValidityMask *)0x0;
      }
      else {
        pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator->(&local_420);
        iVar20 = ValidityMask::Capacity(pVVar13);
        local_3b0.ptr = (ValidityMask *)&true_sel_2;
        TemplatedValidityMask<unsigned_long>::Reset
                  ((TemplatedValidityMask<unsigned_long> *)local_3b0.ptr,iVar20);
      }
      iVar20 = 0;
      local_4c0 = 0;
      while (uVar19 != 0) {
        PositionListCursor(&lcursor,&lvdata_1,iVar20,&slice_sel,uVar19);
        PositionListCursor(&rcursor,&rvdata_1,iVar20,&slice_sel,uVar19);
        psVar2 = (lvdata_1.sel)->sel_vector;
        psVar4 = (rvdata_1.sel)->sel_vector;
        iVar36 = 0;
        iVar16 = 0;
        local_4a0 = 0;
        for (uVar25 = 0; uVar19 != uVar25; uVar25 = uVar25 + 1) {
          uVar33 = uVar25;
          if (slice_sel.sel_vector != (sel_t *)0x0) {
            uVar33 = (ulong)slice_sel.sel_vector[uVar25];
          }
          uVar21 = uVar33;
          if (psVar2 != (sel_t *)0x0) {
            uVar21 = (ulong)psVar2[uVar33];
          }
          uVar14 = uVar33;
          if (psVar4 != (sel_t *)0x0) {
            uVar14 = (ulong)psVar4[uVar33];
          }
          if ((*(idx_t *)(pdVar7 + uVar21 * 0x10 + 8) == iVar20) ||
             (*(idx_t *)(rvdata_1.data + uVar14 * 0x10 + 8) == iVar20)) {
            if (maybe_vec.sel_vector != (sel_t *)0x0) {
              uVar33 = (ulong)maybe_vec.sel_vector[uVar33];
            }
            if (*(idx_t *)(pdVar7 + uVar21 * 0x10 + 8) ==
                *(idx_t *)(rvdata_1.data + uVar14 * 0x10 + 8)) {
              if (true_opt.sel != (SelectionVector *)0x0) {
                (true_opt.sel)->sel_vector[iVar16] = (sel_t)uVar33;
              }
              iVar16 = iVar16 + 1;
            }
            else {
              if (false_opt.sel != (SelectionVector *)0x0) {
                (false_opt.sel)->sel_vector[iVar36] = (sel_t)uVar33;
              }
              iVar36 = iVar36 + 1;
            }
          }
          else {
            true_sel_1.sel_vector[local_4a0] = (sel_t)uVar33;
            local_4a0 = local_4a0 + 1;
          }
        }
        OptionalSelection::Advance(&true_opt,iVar16);
        OptionalSelection::Advance(&false_opt,iVar36);
        uVar25 = uVar19;
        if (local_4a0 < uVar19) {
          DensifyNestedSelection(&true_sel_1,local_4a0,&slice_sel);
          PositionListCursor(&lcursor,&lvdata_1,iVar20,&slice_sel,local_4a0);
          PositionListCursor(&rcursor,&rvdata_1,iVar20,&slice_sel,local_4a0);
          uVar25 = local_4a0;
        }
        ExtractNestedMask(&slice_sel,uVar25,&maybe_vec,local_3b0.ptr,local_420);
        uVar19 = VectorOperations::NestedEquals
                           (&lchild,&rchild,&slice_sel,uVar25,&true_sel_1,&false_sel_1,local_3b0);
        ExtractNestedMask(&slice_sel,uVar25,&maybe_vec,local_3b0.ptr,local_420);
        oVar34.ptr = &false_sel_1;
        if (uVar19 == 0) {
          oVar34.ptr = &slice_sel;
        }
        ExtractNestedSelection(oVar34.ptr,uVar25 - uVar19,&maybe_vec,&false_opt);
        if (uVar25 != uVar19) {
          DensifyNestedSelection(&true_sel_1,uVar19,&slice_sel);
        }
        local_4c0 = local_4c0 + iVar16;
        iVar20 = iVar20 + 1;
      }
LAB_0179a4ba:
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&true_sel_2.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&false_sel_1.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&true_sel_1.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&slice_sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      UnifiedVectorFormat::~UnifiedVectorFormat(&rvdata_1);
      UnifiedVectorFormat::~UnifiedVectorFormat(&lvdata_1);
      Vector::~Vector(&rchild);
      Vector::~Vector(&lchild);
      Vector::~Vector((Vector *)&rvdata);
      Vector::~Vector((Vector *)&lvdata);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rcursor.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&lcursor.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    else {
      if (PVar1 == STRUCT) {
        rcursor.sel_vector = (sel_t *)null_mask.ptr;
        if (uVar19 != 0) {
          rchild.vector_type = FLAT_VECTOR;
          rchild._1_7_ = 0;
          rchild.type.id_ = INVALID;
          rchild.type.physical_type_ = ~INVALID;
          rchild.type._2_6_ = 0;
          rchild.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          lvdata_1.sel = (SelectionVector *)0x0;
          lvdata_1.data = (data_ptr_t)0x0;
          lvdata_1.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          this_00 = StructVector::GetEntries(&l_not_null);
          this_01 = StructVector::GetEntries(&r_not_null);
          SelectionVector::SelectionVector((SelectionVector *)&rvdata_1,uVar19);
          for (iVar20 = 0; uVar19 != iVar20; iVar20 = iVar20 + 1) {
            *(int *)((long)&(rvdata_1.sel)->sel_vector + iVar20 * 4) = (int)iVar20;
          }
          SelectionVector::SelectionVector(&true_sel_2,uVar19);
          SelectionVector::SelectionVector(&lcursor,uVar19);
          lchild.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          lchild.vector_type = FLAT_VECTOR;
          lchild._1_7_ = 0;
          lchild.type.id_ = INVALID;
          lchild.type.physical_type_ = ~INVALID;
          lchild.type._2_6_ = 0;
          lchild.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if (rcursor.sel_vector == (sel_t *)0x0) {
            null_mask_00.ptr = (ValidityMask *)0x0;
          }
          else {
            pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator->
                                ((optional_ptr<duckdb::ValidityMask,_true> *)&rcursor);
            iVar20 = ValidityMask::Capacity(pVVar13);
            null_mask_00.ptr = (ValidityMask *)&lchild;
            TemplatedValidityMask<unsigned_long>::Reset
                      ((TemplatedValidityMask<unsigned_long> *)null_mask_00.ptr,iVar20);
          }
          local_4c0 = 0;
          uVar25 = 0;
          local_498 = (TemplatedValidityMask<unsigned_long> *)uVar19;
          while( true ) {
            if ((ulong)((long)(this_00->
                              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_00->
                              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar25) break;
            pvVar17 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::get<true>(this_00,uVar25);
            pVVar18 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar17);
            Vector::Vector((Vector *)&lvdata,pVVar18);
            Vector::Flatten((Vector *)&lvdata,uVar19);
            Vector::Slice((Vector *)&lvdata,(SelectionVector *)&rvdata_1,(idx_t)local_498);
            pvVar17 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::get<true>(this_01,uVar25);
            pVVar18 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar17);
            Vector::Vector((Vector *)&rvdata,pVVar18);
            Vector::Flatten((Vector *)&rvdata,uVar19);
            Vector::Slice((Vector *)&rvdata,(SelectionVector *)&rvdata_1,(idx_t)local_498);
            ExtractNestedMask((SelectionVector *)&rvdata_1,(idx_t)local_498,&maybe_vec,
                              null_mask_00.ptr,
                              (optional_ptr<duckdb::ValidityMask,_true>)rcursor.sel_vector);
            if (uVar25 == ((long)(this_00->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
              iVar20 = VectorOperations::NestedEquals
                                 ((Vector *)&lvdata,(Vector *)&rvdata,(SelectionVector *)&rvdata_1,
                                  (idx_t)local_498,&true_sel_2,&lcursor,null_mask_00);
              ExtractNestedMask((SelectionVector *)&rvdata_1,(idx_t)local_498,&maybe_vec,
                                null_mask_00.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)rcursor.sel_vector);
              oVar34.ptr = &true_sel_2;
              if (local_498 == (TemplatedValidityMask<unsigned_long> *)iVar20) {
                oVar34.ptr = (SelectionVector *)&rvdata_1;
              }
              ExtractNestedSelection(oVar34.ptr,iVar20,&maybe_vec,&true_opt);
              oVar34.ptr = &lcursor;
              if (iVar20 == 0) {
                oVar34.ptr = (SelectionVector *)&rvdata_1;
              }
              ExtractNestedSelection(oVar34.ptr,(long)local_498 - iVar20,&maybe_vec,&false_opt);
              local_4c0 = local_4c0 + iVar20;
            }
            else {
              iVar20 = VectorOperations::NestedEquals
                                 ((Vector *)&lvdata,(Vector *)&rvdata,(SelectionVector *)&rvdata_1,
                                  (idx_t)local_498,&true_sel_2,&lcursor,null_mask_00);
              ExtractNestedMask((SelectionVector *)&rvdata_1,(idx_t)local_498,&maybe_vec,
                                null_mask_00.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)rcursor.sel_vector);
              oVar34.ptr = &lcursor;
              if (iVar20 == 0) {
                oVar34.ptr = (SelectionVector *)&rvdata_1;
              }
              ExtractNestedSelection(oVar34.ptr,(long)local_498 - iVar20,&maybe_vec,&false_opt);
              if (local_498 != (TemplatedValidityMask<unsigned_long> *)iVar20) {
                DensifyNestedSelection(&true_sel_2,iVar20,(SelectionVector *)&rvdata_1);
                local_498 = (TemplatedValidityMask<unsigned_long> *)iVar20;
              }
            }
            Vector::~Vector((Vector *)&rvdata);
            Vector::~Vector((Vector *)&lvdata);
            uVar25 = uVar25 + 1;
          }
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&lchild.type.type_info_);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&lcursor.selection_data.internal.
                      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&true_sel_2.selection_data.internal.
                      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rvdata_1.validity);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&lvdata_1);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&rchild);
          goto LAB_0179a553;
        }
      }
      else {
        if (PVar1 != ARRAY) {
          this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&lvdata,"Unimplemented type for DISTINCT",(allocator *)&rvdata);
          NotImplementedException::NotImplementedException(this_03,(string *)&lvdata);
          __cxa_throw(this_03,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_420 = (optional_ptr<duckdb::ValidityMask,_true>)
                    (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
        if (uVar19 != 0) {
          iVar20 = ArrayType::GetSize(&l_not_null.type);
          SelectionVector::SelectionVector(&lcursor,uVar19);
          SelectionVector::SelectionVector(&rcursor,uVar19);
          pVVar15 = ArrayVector::GetEntry(&l_not_null);
          Vector::Vector((Vector *)&lvdata,pVVar15);
          pVVar15 = ArrayVector::GetEntry(&r_not_null);
          Vector::Vector((Vector *)&rvdata,pVVar15);
          iVar16 = ArrayVector::GetTotalSize(&l_not_null);
          Vector::Flatten((Vector *)&lvdata,iVar16);
          iVar16 = ArrayVector::GetTotalSize(&r_not_null);
          Vector::Flatten((Vector *)&rvdata,iVar16);
          Vector::Vector(&lchild,(Vector *)&lvdata,&lcursor,uVar19);
          Vector::Vector(&rchild,(Vector *)&rvdata,&rcursor,uVar19);
          UnifiedVectorFormat::UnifiedVectorFormat(&lvdata_1);
          Vector::ToUnifiedFormat(&l_not_null,uVar19,&lvdata_1);
          UnifiedVectorFormat::UnifiedVectorFormat(&rvdata_1);
          Vector::ToUnifiedFormat(&r_not_null,uVar19,&rvdata_1);
          SelectionVector::SelectionVector(&slice_sel,uVar19);
          for (iVar16 = 0; uVar19 != iVar16; iVar16 = iVar16 + 1) {
            slice_sel.sel_vector[iVar16] = (sel_t)iVar16;
          }
          SelectionVector::SelectionVector(&true_sel_1,uVar19);
          SelectionVector::SelectionVector(&false_sel_1,uVar19);
          true_sel_2.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          true_sel_2.sel_vector = (sel_t *)0x0;
          true_sel_2.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          if (local_420.ptr == (ValidityMask *)0x0) {
            local_498 = (TemplatedValidityMask<unsigned_long> *)0x0;
          }
          else {
            pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator->(&local_420);
            iVar16 = ValidityMask::Capacity(pVVar13);
            local_498 = (TemplatedValidityMask<unsigned_long> *)&true_sel_2;
            TemplatedValidityMask<unsigned_long>::Reset(local_498,iVar16);
          }
          local_4c0 = 0;
          iVar16 = 0;
          while (uVar19 != 0) {
            PositionArrayCursor(&lcursor,&lvdata_1,iVar16,&slice_sel,uVar19,iVar20);
            PositionArrayCursor(&rcursor,&rvdata_1,iVar16,&slice_sel,uVar19,iVar20);
            iVar36 = 0;
            uVar25 = 0;
            for (uVar33 = 0; uVar19 != uVar33; uVar33 = uVar33 + 1) {
              uVar21 = uVar33;
              if (slice_sel.sel_vector != (sel_t *)0x0) {
                uVar21 = (ulong)slice_sel.sel_vector[uVar33];
              }
              if (iVar20 == iVar16) {
                if (maybe_vec.sel_vector != (sel_t *)0x0) {
                  uVar21 = (ulong)maybe_vec.sel_vector[uVar21];
                }
                if (true_opt.sel != (SelectionVector *)0x0) {
                  (true_opt.sel)->sel_vector[iVar36] = (sel_t)uVar21;
                }
                iVar36 = iVar36 + 1;
              }
              else {
                true_sel_1.sel_vector[uVar25] = (sel_t)uVar21;
                uVar25 = uVar25 + 1;
              }
            }
            OptionalSelection::Advance(&true_opt,iVar36);
            OptionalSelection::Advance(&false_opt,0);
            uVar33 = uVar19;
            if (uVar25 < uVar19) {
              DensifyNestedSelection(&true_sel_1,uVar25,&slice_sel);
              PositionArrayCursor(&lcursor,&lvdata_1,iVar16,&slice_sel,uVar25,iVar20);
              PositionArrayCursor(&rcursor,&rvdata_1,iVar16,&slice_sel,uVar25,iVar20);
              uVar33 = uVar25;
            }
            ExtractNestedMask(&slice_sel,uVar33,&maybe_vec,(ValidityMask *)local_498,local_420);
            uVar19 = VectorOperations::NestedEquals
                               (&lchild,&rchild,&slice_sel,uVar33,&true_sel_1,&false_sel_1,local_420
                               );
            ExtractNestedMask(&slice_sel,uVar33,&maybe_vec,(ValidityMask *)local_498,local_420);
            oVar34.ptr = &false_sel_1;
            if (uVar19 == 0) {
              oVar34.ptr = &slice_sel;
            }
            ExtractNestedSelection(oVar34.ptr,uVar33 - uVar19,&maybe_vec,&false_opt);
            if (uVar33 != uVar19) {
              DensifyNestedSelection(&true_sel_1,uVar19,&slice_sel);
            }
            local_4c0 = local_4c0 + iVar36;
            iVar16 = iVar16 + 1;
          }
          goto LAB_0179a4ba;
        }
      }
LAB_01796f19:
      local_4c0 = 0;
    }
LAB_0179a553:
    local_4c0 = local_4c0 + local_390;
    if (true_sel.ptr != (SelectionVector *)0x0) {
      pSVar12 = optional_ptr<duckdb::SelectionVector,_true>::operator*(&local_1a0);
      DensifyNestedSelection(&true_vec,local_4c0,pSVar12);
    }
    if (local_260.ptr != (SelectionVector *)0x0) {
      pSVar12 = optional_ptr<duckdb::SelectionVector,_true>::operator*(&local_260);
      DensifyNestedSelection(&false_vec,count - local_4c0,pSVar12);
    }
    Vector::~Vector(&r_not_null);
    Vector::~Vector(&l_not_null);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&maybe_vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&false_opt.vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&false_vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&true_opt.vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pUVar11 = (UnifiedVectorFormat *)&true_vec;
LAB_017a167c:
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pUVar11->validity);
    return local_4c0;
  default:
    if (PVar1 == VARCHAR) {
      lchild._0_8_ = null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(left,sel.ptr,count,pVVar13);
        pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(right,sel.ptr,count,pVVar13);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          psVar29 = (string_t *)left->data;
          psVar41 = (string_t *)right->data;
          FlatVector::VerifyFlatVector(left);
          pVVar13 = &left->validity;
          FlatVector::VerifyFlatVector(right);
          pVVar35 = &right->validity;
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            lVar24 = 0;
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<duckdb::string_t>(psVar29,psVar41,!bVar44,!bVar45)
              ;
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              psVar41 = psVar41 + 1;
              psVar29 = psVar29 + 1;
            }
            return local_4c0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<duckdb::string_t>(psVar29,psVar41,!bVar44,!bVar45)
              ;
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              psVar41 = psVar41 + 1;
              psVar29 = psVar29 + 1;
            }
            return local_4c0;
          }
          lVar24 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<duckdb::string_t>(psVar29,psVar41,!bVar44,!bVar45);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)!bVar44;
            psVar41 = psVar41 + 1;
            psVar29 = psVar29 + 1;
          }
          goto LAB_017a0a64;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          psVar29 = (string_t *)left->data;
          psVar41 = (string_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(left);
          pVVar13 = &left->validity;
          iVar20 = 0;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar24 = 0;
              for (; count != iVar20; iVar20 = iVar20 + 1) {
                iVar16 = iVar20;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
                }
                bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar45 = false;
                }
                else {
                  bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar44 = NotDistinctFrom::Operation<duckdb::string_t>
                                   (psVar29,psVar41,!bVar44,bVar45);
                (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
                lVar24 = lVar24 + (ulong)!bVar44;
                psVar29 = psVar29 + 1;
              }
              goto LAB_017a166a;
            }
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar44 = NotDistinctFrom::Operation<duckdb::string_t>(psVar29,psVar41,!bVar44,bVar45);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              psVar29 = psVar29 + 1;
            }
          }
          else {
            lVar24 = 0;
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar44 = NotDistinctFrom::Operation<duckdb::string_t>(psVar29,psVar41,!bVar44,bVar45);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              psVar29 = psVar29 + 1;
            }
          }
          goto LAB_017a1677;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          psVar29 = (string_t *)left->data;
          psVar41 = (string_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(right);
          pVVar13 = &right->validity;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            iVar20 = 0;
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar24 = 0;
              for (; count != iVar20; iVar20 = iVar20 + 1) {
                iVar16 = iVar20;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
                }
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar44 = false;
                }
                else {
                  bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
                bVar44 = NotDistinctFrom::Operation<duckdb::string_t>
                                   (psVar29,psVar41,bVar44,!bVar45);
                (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
                lVar24 = lVar24 + (ulong)!bVar44;
                psVar41 = psVar41 + 1;
              }
              goto LAB_017a166a;
            }
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<duckdb::string_t>(psVar29,psVar41,bVar44,!bVar45);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              psVar41 = psVar41 + 1;
            }
          }
          else {
            lVar24 = 0;
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<duckdb::string_t>(psVar29,psVar41,bVar44,!bVar45);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              psVar41 = psVar41 + 1;
            }
          }
          goto LAB_017a1677;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar44 = false;
          }
          else {
            bVar44 = (*puVar3 & 1) == 0;
          }
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (*puVar3 & 1) == 0;
          }
          bVar44 = NotDistinctFrom::Operation<duckdb::string_t>
                             ((string_t *)left->data,(string_t *)right->data,bVar44,bVar45);
          if (!bVar44) {
            if (false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
            }
            return 0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
            }
            return count;
          }
          return count;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
      Vector::ToUnifiedFormat(left,count,&lvdata);
      Vector::ToUnifiedFormat(right,count,&rvdata);
      if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0 &&
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          iVar20 = 0;
          for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
            iVar36 = iVar16;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
            }
            iVar22 = iVar16;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
            }
            iVar37 = iVar16;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
            }
            bVar44 = NotDistinctFrom::Operation<duckdb::string_t>
                               ((string_t *)(lvdata.data + iVar22 * 0x10),
                                (string_t *)(rvdata.data + iVar37 * 0x10),false,false);
            if (bVar44) {
              iVar22 = local_4c0;
              oVar23.ptr = true_sel.ptr;
              iVar37 = iVar20;
              local_4c0 = local_4c0 + 1;
            }
            else {
              iVar37 = iVar20 + 1;
              iVar22 = iVar20;
              oVar23.ptr = false_sel.ptr;
            }
            (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
            iVar20 = iVar37;
          }
          goto LAB_0179fa33;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            iVar36 = iVar20;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
            }
            iVar22 = iVar20;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
            }
            bVar44 = NotDistinctFrom::Operation<duckdb::string_t>
                               ((string_t *)(lvdata.data + iVar36 * 0x10),
                                (string_t *)(rvdata.data + iVar22 * 0x10),false,false);
            if (bVar44) {
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + 1;
            }
          }
          goto LAB_0179fa33;
        }
        lVar24 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          iVar36 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          bVar44 = NotDistinctFrom::Operation<duckdb::string_t>
                             ((string_t *)(lvdata.data + iVar36 * 0x10),
                              (string_t *)(rvdata.data + iVar22 * 0x10),false,false);
          if (!bVar44) {
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + 1;
          }
        }
        goto LAB_0179f824;
      }
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
          iVar36 = iVar16;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
          }
          iVar22 = iVar16;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
          }
          iVar37 = iVar16;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar44 = false;
          }
          else {
            bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) == 0;
          }
          bVar44 = NotDistinctFrom::Operation<duckdb::string_t>
                             ((string_t *)(lvdata.data + iVar22 * 0x10),
                              (string_t *)(rvdata.data + iVar37 * 0x10),bVar44,bVar45);
          if (bVar44) {
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar37 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar37 = iVar20 + 1;
            iVar22 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
          iVar20 = iVar37;
        }
        goto LAB_0179fa33;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          iVar36 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar44 = false;
          }
          else {
            bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
          }
          bVar44 = NotDistinctFrom::Operation<duckdb::string_t>
                             ((string_t *)(lvdata.data + iVar36 * 0x10),
                              (string_t *)(rvdata.data + iVar22 * 0x10),bVar44,bVar45);
          if (bVar44) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0179fa33;
      }
      lVar24 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
        }
        bVar44 = NotDistinctFrom::Operation<duckdb::string_t>
                           ((string_t *)(lvdata.data + iVar36 * 0x10),
                            (string_t *)(rvdata.data + iVar22 * 0x10),bVar44,bVar45);
        if (!bVar44) {
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + 1;
        }
      }
    }
    else if (PVar1 == UINT128) {
      lchild._0_8_ = null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(left,sel.ptr,count,pVVar13);
        pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(right,sel.ptr,count,pVVar13);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          puVar30 = (uhugeint_t *)left->data;
          puVar42 = (uhugeint_t *)right->data;
          FlatVector::VerifyFlatVector(left);
          pVVar13 = &left->validity;
          FlatVector::VerifyFlatVector(right);
          pVVar35 = &right->validity;
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            lVar24 = 0;
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar42,!bVar44,!bVar45);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              puVar42 = puVar42 + 1;
              puVar30 = puVar30 + 1;
            }
            return local_4c0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar42,!bVar44,!bVar45);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              puVar42 = puVar42 + 1;
              puVar30 = puVar30 + 1;
            }
            return local_4c0;
          }
          lVar24 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>(puVar30,puVar42,!bVar44,!bVar45)
            ;
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)!bVar44;
            puVar42 = puVar42 + 1;
            puVar30 = puVar30 + 1;
          }
          goto LAB_017a0a64;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar30 = (uhugeint_t *)left->data;
          puVar42 = (uhugeint_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(left);
          pVVar13 = &left->validity;
          iVar20 = 0;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar24 = 0;
              for (; count != iVar20; iVar20 = iVar20 + 1) {
                iVar16 = iVar20;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
                }
                bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar45 = false;
                }
                else {
                  bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                                   (puVar30,puVar42,!bVar44,bVar45);
                (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
                lVar24 = lVar24 + (ulong)!bVar44;
                puVar30 = puVar30 + 1;
              }
              goto LAB_017a166a;
            }
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar42,!bVar44,bVar45);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              puVar30 = puVar30 + 1;
            }
          }
          else {
            lVar24 = 0;
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar42,!bVar44,bVar45);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              puVar30 = puVar30 + 1;
            }
          }
          goto LAB_017a1677;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          puVar30 = (uhugeint_t *)left->data;
          puVar42 = (uhugeint_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(right);
          pVVar13 = &right->validity;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            iVar20 = 0;
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar24 = 0;
              for (; count != iVar20; iVar20 = iVar20 + 1) {
                iVar16 = iVar20;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
                }
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar44 = false;
                }
                else {
                  bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
                bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                                   (puVar30,puVar42,bVar44,!bVar45);
                (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
                lVar24 = lVar24 + (ulong)!bVar44;
                puVar42 = puVar42 + 1;
              }
              goto LAB_017a166a;
            }
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar42,bVar44,!bVar45);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              puVar42 = puVar42 + 1;
            }
          }
          else {
            lVar24 = 0;
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                                 (puVar30,puVar42,bVar44,!bVar45);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              puVar42 = puVar42 + 1;
            }
          }
          goto LAB_017a1677;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar44 = false;
          }
          else {
            bVar44 = (*puVar3 & 1) == 0;
          }
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (*puVar3 & 1) == 0;
          }
          bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                             ((uhugeint_t *)left->data,(uhugeint_t *)right->data,bVar44,bVar45);
          if (!bVar44) {
            if (false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
            }
            return 0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
            }
            return count;
          }
          return count;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
      Vector::ToUnifiedFormat(left,count,&lvdata);
      Vector::ToUnifiedFormat(right,count,&rvdata);
      if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0 &&
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          iVar20 = 0;
          for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
            iVar36 = iVar16;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
            }
            iVar22 = iVar16;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
            }
            iVar37 = iVar16;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
            }
            bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                               ((uhugeint_t *)(lvdata.data + iVar22 * 0x10),
                                (uhugeint_t *)(rvdata.data + iVar37 * 0x10),false,false);
            if (bVar44) {
              iVar22 = local_4c0;
              oVar23.ptr = true_sel.ptr;
              iVar37 = iVar20;
              local_4c0 = local_4c0 + 1;
            }
            else {
              iVar37 = iVar20 + 1;
              iVar22 = iVar20;
              oVar23.ptr = false_sel.ptr;
            }
            (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
            iVar20 = iVar37;
          }
          goto LAB_0179fa33;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4c0 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            iVar36 = iVar20;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
            }
            iVar22 = iVar20;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
            }
            bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                               ((uhugeint_t *)(lvdata.data + iVar36 * 0x10),
                                (uhugeint_t *)(rvdata.data + iVar22 * 0x10),false,false);
            if (bVar44) {
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + 1;
            }
          }
          goto LAB_0179fa33;
        }
        lVar24 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          iVar36 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                             ((uhugeint_t *)(lvdata.data + iVar36 * 0x10),
                              (uhugeint_t *)(rvdata.data + iVar22 * 0x10),false,false);
          if (!bVar44) {
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + 1;
          }
        }
        goto LAB_0179f824;
      }
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
          iVar36 = iVar16;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
          }
          iVar22 = iVar16;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
          }
          iVar37 = iVar16;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar44 = false;
          }
          else {
            bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) == 0;
          }
          bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                             ((uhugeint_t *)(lvdata.data + iVar22 * 0x10),
                              (uhugeint_t *)(rvdata.data + iVar37 * 0x10),bVar44,bVar45);
          if (bVar44) {
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar37 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar37 = iVar20 + 1;
            iVar22 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
          iVar20 = iVar37;
        }
        goto LAB_0179fa33;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          iVar36 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar44 = false;
          }
          else {
            bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
          }
          bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                             ((uhugeint_t *)(lvdata.data + iVar36 * 0x10),
                              (uhugeint_t *)(rvdata.data + iVar22 * 0x10),bVar44,bVar45);
          if (bVar44) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0179fa33;
      }
      lVar24 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
        }
        bVar44 = NotDistinctFrom::Operation<duckdb::uhugeint_t>
                           ((uhugeint_t *)(lvdata.data + iVar36 * 0x10),
                            (uhugeint_t *)(rvdata.data + iVar22 * 0x10),bVar44,bVar45);
        if (!bVar44) {
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + 1;
        }
      }
    }
    else {
      if (PVar1 != INT128) goto switchD_01795edd_caseD_a;
      lchild._0_8_ = null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(left,sel.ptr,count,pVVar13);
        pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(right,sel.ptr,count,pVVar13);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          phVar31 = (hugeint_t *)left->data;
          phVar43 = (hugeint_t *)right->data;
          FlatVector::VerifyFlatVector(left);
          pVVar13 = &left->validity;
          FlatVector::VerifyFlatVector(right);
          pVVar35 = &right->validity;
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            lVar24 = 0;
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<duckdb::hugeint_t>
                                 (phVar31,phVar43,!bVar44,!bVar45);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              phVar43 = phVar43 + 1;
              phVar31 = phVar31 + 1;
            }
            return local_4c0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<duckdb::hugeint_t>
                                 (phVar31,phVar43,!bVar44,!bVar45);
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              phVar43 = phVar43 + 1;
              phVar31 = phVar31 + 1;
            }
            return local_4c0;
          }
          lVar24 = 0;
          for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
            iVar16 = iVar20;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
            }
            bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar35->super_TemplatedValidityMask<unsigned_long>,iVar20);
            bVar44 = NotDistinctFrom::Operation<duckdb::hugeint_t>(phVar31,phVar43,!bVar44,!bVar45);
            (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
            lVar24 = lVar24 + (ulong)!bVar44;
            phVar43 = phVar43 + 1;
            phVar31 = phVar31 + 1;
          }
          goto LAB_017a0a64;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          phVar31 = (hugeint_t *)left->data;
          phVar43 = (hugeint_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(left);
          pVVar13 = &left->validity;
          iVar20 = 0;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar24 = 0;
              for (; count != iVar20; iVar20 = iVar20 + 1) {
                iVar16 = iVar20;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
                }
                bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar45 = false;
                }
                else {
                  bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar44 = NotDistinctFrom::Operation<duckdb::hugeint_t>
                                   (phVar31,phVar43,!bVar44,bVar45);
                (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
                lVar24 = lVar24 + (ulong)!bVar44;
                phVar31 = phVar31 + 1;
              }
              goto LAB_017a166a;
            }
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar44 = NotDistinctFrom::Operation<duckdb::hugeint_t>(phVar31,phVar43,!bVar44,bVar45)
              ;
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              phVar31 = phVar31 + 1;
            }
          }
          else {
            lVar24 = 0;
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              bVar44 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar44 = NotDistinctFrom::Operation<duckdb::hugeint_t>(phVar31,phVar43,!bVar44,bVar45)
              ;
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              phVar31 = phVar31 + 1;
            }
          }
          goto LAB_017a1677;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          phVar31 = (hugeint_t *)left->data;
          phVar43 = (hugeint_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(right);
          pVVar13 = &right->validity;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            iVar20 = 0;
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar24 = 0;
              for (; count != iVar20; iVar20 = iVar20 + 1) {
                iVar16 = iVar20;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
                }
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar44 = false;
                }
                else {
                  bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
                bVar44 = NotDistinctFrom::Operation<duckdb::hugeint_t>
                                   (phVar31,phVar43,bVar44,!bVar45);
                (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
                lVar24 = lVar24 + (ulong)!bVar44;
                phVar43 = phVar43 + 1;
              }
              goto LAB_017a166a;
            }
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<duckdb::hugeint_t>(phVar31,phVar43,bVar44,!bVar45)
              ;
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              phVar43 = phVar43 + 1;
            }
          }
          else {
            lVar24 = 0;
            local_4c0 = 0;
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar44 = false;
              }
              else {
                bVar44 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar20);
              bVar44 = NotDistinctFrom::Operation<duckdb::hugeint_t>(phVar31,phVar43,bVar44,!bVar45)
              ;
              (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
              local_4c0 = local_4c0 + bVar44;
              (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
              lVar24 = lVar24 + (ulong)!bVar44;
              phVar43 = phVar43 + 1;
            }
          }
          goto LAB_017a1677;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar44 = false;
          }
          else {
            bVar44 = (*puVar3 & 1) == 0;
          }
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (*puVar3 & 1) == 0;
          }
          bVar44 = NotDistinctFrom::Operation<duckdb::hugeint_t>
                             ((hugeint_t *)left->data,(hugeint_t *)right->data,bVar44,bVar45);
          if (!bVar44) {
            if (false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              (false_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
            }
            return 0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              (true_sel.ptr)->sel_vector[iVar20] = (sel_t)iVar16;
            }
            return count;
          }
          return count;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
      Vector::ToUnifiedFormat(left,count,&lvdata);
      Vector::ToUnifiedFormat(right,count,&rvdata);
      if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0 &&
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar20 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar24 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              iVar36 = iVar20;
              if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
                iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
              }
              iVar22 = iVar20;
              if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
                iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
              }
              if ((*(long *)(lvdata.data + iVar36 * 0x10) != *(long *)(rvdata.data + iVar22 * 0x10))
                 || (*(long *)(lvdata.data + iVar36 * 0x10 + 8) !=
                     *(long *)(rvdata.data + iVar22 * 0x10 + 8))) {
                (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
                lVar24 = lVar24 + 1;
              }
            }
            local_4c0 = count - lVar24;
          }
          else {
            local_4c0 = 0;
            for (; count != iVar20; iVar20 = iVar20 + 1) {
              iVar16 = iVar20;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
              }
              iVar36 = iVar20;
              if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
                iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
              }
              iVar22 = iVar20;
              if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
                iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
              }
              if ((*(long *)(lvdata.data + iVar36 * 0x10) == *(long *)(rvdata.data + iVar22 * 0x10))
                 && (*(long *)(lvdata.data + iVar36 * 0x10 + 8) ==
                     *(long *)(rvdata.data + iVar22 * 0x10 + 8))) {
                (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
                local_4c0 = local_4c0 + 1;
              }
            }
          }
        }
        else {
          local_4c0 = 0;
          iVar20 = 0;
          for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
            iVar36 = iVar16;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
            }
            iVar22 = iVar16;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
            }
            iVar37 = iVar16;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
            }
            if ((*(long *)(lvdata.data + iVar22 * 0x10) == *(long *)(rvdata.data + iVar37 * 0x10))
               && (*(long *)(lvdata.data + iVar22 * 0x10 + 8) ==
                   *(long *)(rvdata.data + iVar37 * 0x10 + 8))) {
              iVar22 = iVar20;
              iVar20 = local_4c0;
              oVar23.ptr = true_sel.ptr;
              local_4c0 = local_4c0 + 1;
            }
            else {
              iVar22 = iVar20 + 1;
              oVar23.ptr = false_sel.ptr;
            }
            (oVar23.ptr)->sel_vector[iVar20] = (sel_t)iVar36;
            iVar20 = iVar22;
          }
        }
        goto LAB_0179fa33;
      }
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        iVar20 = 0;
        for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
          iVar36 = iVar16;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(sel.ptr)->sel_vector[iVar16];
          }
          iVar22 = iVar16;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(lvdata.sel)->sel_vector[iVar16];
          }
          iVar37 = iVar16;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar37 = (idx_t)(rvdata.sel)->sel_vector[iVar16];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar44 = false;
          }
          else {
            bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar37 >> 6] >> (iVar37 & 0x3f) & 1) == 0;
          }
          bVar44 = NotDistinctFrom::Operation<duckdb::hugeint_t>
                             ((hugeint_t *)(lvdata.data + iVar22 * 0x10),
                              (hugeint_t *)(rvdata.data + iVar37 * 0x10),bVar44,bVar45);
          if (bVar44) {
            iVar22 = local_4c0;
            oVar23.ptr = true_sel.ptr;
            iVar37 = iVar20;
            local_4c0 = local_4c0 + 1;
          }
          else {
            iVar37 = iVar20 + 1;
            iVar22 = iVar20;
            oVar23.ptr = false_sel.ptr;
          }
          (oVar23.ptr)->sel_vector[iVar22] = (sel_t)iVar36;
          iVar20 = iVar37;
        }
        goto LAB_0179fa33;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4c0 = 0;
        for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
          iVar16 = iVar20;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
          }
          iVar36 = iVar20;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
          }
          iVar22 = iVar20;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar44 = false;
          }
          else {
            bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
          }
          bVar44 = NotDistinctFrom::Operation<duckdb::hugeint_t>
                             ((hugeint_t *)(lvdata.data + iVar36 * 0x10),
                              (hugeint_t *)(rvdata.data + iVar22 * 0x10),bVar44,bVar45);
          if (bVar44) {
            (true_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar16;
            local_4c0 = local_4c0 + 1;
          }
        }
        goto LAB_0179fa33;
      }
      lVar24 = 0;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar16 = iVar20;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(sel.ptr)->sel_vector[iVar20];
        }
        iVar36 = iVar20;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar36 = (idx_t)(lvdata.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(rvdata.sel)->sel_vector[iVar20];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar44 = false;
        }
        else {
          bVar44 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar36 >> 6] >> (iVar36 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) == 0;
        }
        bVar44 = NotDistinctFrom::Operation<duckdb::hugeint_t>
                           ((hugeint_t *)(lvdata.data + iVar36 * 0x10),
                            (hugeint_t *)(rvdata.data + iVar22 * 0x10),bVar44,bVar45);
        if (!bVar44) {
          (false_sel.ptr)->sel_vector[lVar24] = (sel_t)iVar16;
          lVar24 = lVar24 + 1;
        }
      }
    }
LAB_0179fa26:
    local_4c0 = count - lVar24;
    goto LAB_0179fa33;
  }
  local_4c0 = count - lVar24;
LAB_0179fa33:
  UnifiedVectorFormat::~UnifiedVectorFormat(&rvdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&lvdata);
  return local_4c0;
}

Assistant:

static idx_t TemplatedDistinctSelectOperation(Vector &left, Vector &right, optional_ptr<const SelectionVector> sel,
                                              idx_t count, optional_ptr<SelectionVector> true_sel,
                                              optional_ptr<SelectionVector> false_sel,
                                              optional_ptr<ValidityMask> null_mask) {

	switch (left.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return DistinctSelect<int8_t, int8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INT16:
		return DistinctSelect<int16_t, int16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT32:
		return DistinctSelect<int32_t, int32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT64:
		return DistinctSelect<int64_t, int64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT8:
		return DistinctSelect<uint8_t, uint8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT16:
		return DistinctSelect<uint16_t, uint16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT32:
		return DistinctSelect<uint32_t, uint32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT64:
		return DistinctSelect<uint64_t, uint64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::INT128:
		return DistinctSelect<hugeint_t, hugeint_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                                null_mask);
	case PhysicalType::UINT128:
		return DistinctSelect<uhugeint_t, uhugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::FLOAT:
		return DistinctSelect<float, float, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                        null_mask);
	case PhysicalType::DOUBLE:
		return DistinctSelect<double, double, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INTERVAL:
		return DistinctSelect<interval_t, interval_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::VARCHAR:
		return DistinctSelect<string_t, string_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return DistinctSelectNested<OP>(left, right, sel, count, true_sel, false_sel, null_mask);
	default:
		throw InternalException("Invalid type for distinct selection");
	}
}